

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

char * ImGui::SaveIniSettingsToMemory(size_t *out_size)

{
  ImGuiTextBuffer *this;
  int iVar1;
  ImGuiSettingsHandler *pIVar2;
  ImGuiContext *pIVar3;
  int iVar4;
  char *pcVar5;
  long lVar6;
  int handler_n;
  long lVar7;
  char local_29;
  
  pIVar3 = GImGui;
  GImGui->SettingsDirtyTimer = 0.0;
  this = &pIVar3->SettingsIniData;
  lVar6 = 0;
  ImVector<char>::resize(&this->Buf,0);
  local_29 = '\0';
  ImVector<char>::push_back(&this->Buf,&local_29);
  for (lVar7 = 0; lVar7 < (pIVar3->SettingsHandlers).Size; lVar7 = lVar7 + 1) {
    pIVar2 = (pIVar3->SettingsHandlers).Data;
    (**(code **)((long)&pIVar2->WriteAllFn + lVar6))(pIVar3,(long)&pIVar2->TypeName + lVar6,this);
    lVar6 = lVar6 + 0x48;
  }
  if (out_size != (size_t *)0x0) {
    iVar1 = (this->Buf).Size;
    iVar4 = iVar1 + -1;
    if (iVar1 == 0) {
      iVar4 = 0;
    }
    *out_size = (long)iVar4;
  }
  pcVar5 = (pIVar3->SettingsIniData).Buf.Data;
  if (pcVar5 == (char *)0x0) {
    pcVar5 = ImGuiTextBuffer::EmptyString;
  }
  return pcVar5;
}

Assistant:

const char* ImGui::SaveIniSettingsToMemory(size_t* out_size)
{
    ImGuiContext& g = *GImGui;
    g.SettingsDirtyTimer = 0.0f;
    g.SettingsIniData.Buf.resize(0);
    g.SettingsIniData.Buf.push_back(0);
    for (int handler_n = 0; handler_n < g.SettingsHandlers.Size; handler_n++)
    {
        ImGuiSettingsHandler* handler = &g.SettingsHandlers[handler_n];
        handler->WriteAllFn(&g, handler, &g.SettingsIniData);
    }
    if (out_size)
        *out_size = (size_t)g.SettingsIniData.size();
    return g.SettingsIniData.c_str();
}